

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int renameUnmapSelectCb(Walker *pWalker,Select *p)

{
  Parse *pParse_00;
  ExprList *pEVar1;
  SrcList *pSVar2;
  SrcList *pSrc;
  ExprList *pList;
  int i;
  Parse *pParse;
  Select *p_local;
  Walker *pWalker_local;
  
  pParse_00 = pWalker->pParse;
  if (p->pEList != (ExprList *)0x0) {
    pEVar1 = p->pEList;
    for (pList._4_4_ = 0; pList._4_4_ < pEVar1->nExpr; pList._4_4_ = pList._4_4_ + 1) {
      if (pEVar1->a[pList._4_4_].zName != (char *)0x0) {
        sqlite3RenameTokenRemap(pParse_00,(void *)0x0,pEVar1->a[pList._4_4_].zName);
      }
    }
  }
  if (p->pSrc != (SrcList *)0x0) {
    pSVar2 = p->pSrc;
    for (pList._4_4_ = 0; pList._4_4_ < pSVar2->nSrc; pList._4_4_ = pList._4_4_ + 1) {
      sqlite3RenameTokenRemap(pParse_00,(void *)0x0,pSVar2->a[pList._4_4_].zName);
    }
  }
  return 0;
}

Assistant:

static int renameUnmapSelectCb(Walker *pWalker, Select *p){
  Parse *pParse = pWalker->pParse;
  int i;
  if( ALWAYS(p->pEList) ){
    ExprList *pList = p->pEList;
    for(i=0; i<pList->nExpr; i++){
      if( pList->a[i].zName ){
        sqlite3RenameTokenRemap(pParse, 0, (void*)pList->a[i].zName);
      }
    }
  }
  if( ALWAYS(p->pSrc) ){  /* Every Select as a SrcList, even if it is empty */
    SrcList *pSrc = p->pSrc;
    for(i=0; i<pSrc->nSrc; i++){
      sqlite3RenameTokenRemap(pParse, 0, (void*)pSrc->a[i].zName);
    }
  }
  return WRC_Continue;
}